

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

void __thiscall gimage::ImageIO::ImageIO(ImageIO *this)

{
  undefined8 *puVar1;
  vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_> *in_RDI;
  value_type *in_stack_ffffffffffffff58;
  vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_> *in_stack_ffffffffffffff60
  ;
  
  std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>::vector
            ((vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_> *)0x15e171);
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = 0;
  PNMImageIO::PNMImageIO((PNMImageIO *)in_stack_ffffffffffffff60);
  std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>::push_back
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = 0;
  RAWImageIO::RAWImageIO((RAWImageIO *)in_stack_ffffffffffffff60);
  std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>::push_back
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = 0;
  TIFFImageIO::TIFFImageIO((TIFFImageIO *)in_stack_ffffffffffffff60);
  std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>::push_back
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = 0;
  PNGImageIO::PNGImageIO((PNGImageIO *)in_stack_ffffffffffffff60);
  std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>::push_back
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = 0;
  JPEGImageIO::JPEGImageIO((JPEGImageIO *)in_RDI);
  std::vector<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>::push_back
            (in_RDI,in_stack_ffffffffffffff58);
  return;
}

Assistant:

ImageIO::ImageIO()
{
  list.push_back(new PNMImageIO());
  list.push_back(new RAWImageIO());

#ifdef INCLUDE_GDAL
  list.push_back(new GDALImageIO());
#endif

#ifdef INCLUDE_TIFF
  list.push_back(new TIFFImageIO());
#endif

#ifdef INCLUDE_PNG
  list.push_back(new PNGImageIO());
#endif

#ifdef INCLUDE_JPEG
  list.push_back(new JPEGImageIO());
#endif
}